

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,string *path,VariableDeclaration *var)

{
  bool bVar1;
  Data local_48;
  undefined4 local_40;
  
  glu::parseVariableName_abi_cxx11_((string *)&local_48,(glu *)(path->_M_dataplus)._M_p,(char *)var)
  ;
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_48,&var->name);
  std::__cxx11::string::~string((string *)&local_48);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    local_40 = 2;
    local_48.declaration = var;
    std::
    vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
    ::emplace_back<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>
              (typePath,(VariablePathComponent *)&local_48);
    bVar1 = traverseVariablePath
                      (typePath,(path->_M_dataplus)._M_p + (var->name)._M_string_length,
                       &var->varType);
  }
  return bVar1;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const std::string& path, const glu::VariableDeclaration& var)
{
	if (glu::parseVariableName(path.c_str()) != var.name)
		return false;

	typePath.push_back(VariablePathComponent(&var));
	return traverseVariablePath(typePath, path.c_str() + var.name.length(), var.varType);
}